

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

BlockStatement *
slang::ast::createBlockStatement
          (Compilation *comp,SmallVectorBase<const_slang::ast::Statement_*> *buffer,
          SyntaxNode *syntax,StatementBlockKind blocKind)

{
  int iVar1;
  size_type sVar2;
  undefined4 extraout_var;
  BlockStatement *pBVar3;
  undefined4 in_ECX;
  EVP_PKEY_CTX *src;
  BumpAllocator *extraout_RDX;
  SmallVectorBase<const_slang::ast::Statement_*> *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  SyntaxNode *unaff_retaddr;
  Statement *body;
  SourceRange in_stack_ffffffffffffffb8;
  Statement *in_stack_ffffffffffffffc8;
  BumpAllocator *in_stack_ffffffffffffffd0;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar2 = SmallVectorBase<const_slang::ast::Statement_*>::size(in_RSI);
  if (sVar2 == 1) {
    SmallVectorBase<const_slang::ast::Statement_*>::operator[](in_RSI,0);
  }
  else {
    iVar1 = SmallVectorBase<const_slang::ast::Statement_*>::copy(in_RSI,in_RDI,src);
    in_stack_ffffffffffffffc8 = (Statement *)CONCAT44(extraout_var,iVar1);
    in_stack_ffffffffffffffd0 = extraout_RDX;
    in_stack_ffffffffffffffb8 = slang::syntax::SyntaxNode::sourceRange(unaff_retaddr);
    BumpAllocator::
    emplace<slang::ast::StatementList,std::span<slang::ast::Statement_const*,18446744073709551615ul>,slang::SourceRange>
              ((BumpAllocator *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8
               ,(SourceRange *)in_stack_ffffffffffffffd0);
  }
  pBVar3 = BumpAllocator::
           emplace<slang::ast::BlockStatement,slang::ast::Statement_const&,slang::ast::StatementBlockKind&,slang::SourceRange_const&>
                     (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                      (StatementBlockKind *)in_stack_ffffffffffffffb8.endLoc,
                      (SourceRange *)in_stack_ffffffffffffffb8.startLoc);
  return pBVar3;
}

Assistant:

static BlockStatement* createBlockStatement(
    Compilation& comp, SmallVectorBase<const Statement*>& buffer, const SyntaxNode& syntax,
    StatementBlockKind blocKind = StatementBlockKind::Sequential) {

    const Statement* body;
    if (buffer.size() == 1)
        body = buffer[0];
    else
        body = comp.emplace<StatementList>(buffer.copy(comp), syntax.sourceRange());

    return comp.emplace<BlockStatement>(*body, blocKind, body->sourceRange);
}